

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjAttrSize(Cba_Ntk_t *p,int i)

{
  int iVar1;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
  }
  iVar1 = Cba_ObjAttr(p,i);
  if (iVar1 != 0) {
    iVar1 = Cba_ObjAttr(p,i);
    iVar1 = Vec_IntEntry(&p->vAttrSto,iVar1);
    return iVar1;
  }
  return 0;
}

Assistant:

static inline int            Cba_ObjAttrSize( Cba_Ntk_t * p, int i )         { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntry(&p->vAttrSto, Cba_ObjAttr(p, i)) : 0; }